

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_d.cpp
# Opt level: O0

void daxpy(int n,double da,double *dx,int incx,double *dy,int incy)

{
  int iVar1;
  int local_40;
  int m;
  int iy;
  int ix;
  int i;
  int incy_local;
  double *dy_local;
  int incx_local;
  double *dx_local;
  double da_local;
  int n_local;
  
  if ((0 < n) && ((da != 0.0 || (NAN(da))))) {
    if ((incx == 1) && (incy == 1)) {
      for (iy = 0; iVar1 = n % 4, iy < n % 4; iy = iy + 1) {
        dy[iy] = da * dx[iy] + dy[iy];
      }
      while (iy = iVar1, iy < n) {
        dy[iy] = da * dx[iy] + dy[iy];
        dy[iy + 1] = da * dx[iy + 1] + dy[iy + 1];
        dy[iy + 2] = da * dx[iy + 2] + dy[iy + 2];
        dy[iy + 3] = da * dx[iy + 3] + dy[iy + 3];
        iVar1 = iy + 4;
      }
    }
    else {
      if (incx < 0) {
        m = (1 - n) * incx;
      }
      else {
        m = 0;
      }
      if (incy < 0) {
        local_40 = (1 - n) * incy;
      }
      else {
        local_40 = 0;
      }
      for (iy = 0; iy < n; iy = iy + 1) {
        dy[local_40] = da * dx[m] + dy[local_40];
        m = m + incx;
        local_40 = local_40 + incy;
      }
    }
  }
  return;
}

Assistant:

void daxpy ( int n, double da, double dx[], int incx, double dy[], int incy )

//****************************************************************************80
//
//  Purpose:
//
//    DAXPY computes constant times a vector plus a vector.
//
//  Discussion:
//
//    This routine uses unrolled loops for increments equal to one.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 May 2005
//
//  Author:
//
//    Original FORTRAN77 version by Charles Lawson, Richard Hanson, 
//    David Kincaid, Fred Krogh.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of elements in DX and DY.
//
//    Input, double DA, the multiplier of DX.
//
//    Input, double DX[*], the first vector.
//
//    Input, int INCX, the increment between successive entries of DX.
//
//    Input/output, double DY[*], the second vector.
//    On output, DY[*] has been replaced by DY[*] + DA * DX[*].
//
//    Input, int INCY, the increment between successive entries of DY.
//
{
  int i;
  int ix;
  int iy;
  int m;

  if ( n <= 0 )
  {
    return;
  }

  if ( da == 0.0 )
  {
    return;
  }
//
//  Code for unequal increments or equal increments
//  not equal to 1.
//
  if ( incx != 1 || incy != 1 )
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( - n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( - n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      dy[iy] = dy[iy] + da * dx[ix];
      ix = ix + incx;
      iy = iy + incy;
    }
  }
//
//  Code for both increments equal to 1.
//
  else
  {
    m = n % 4;

    for ( i = 0; i < m; i++ )
    {
      dy[i] = dy[i] + da * dx[i];
    }

    for ( i = m; i < n; i = i + 4 )
    {
      dy[i  ] = dy[i  ] + da * dx[i  ];
      dy[i+1] = dy[i+1] + da * dx[i+1];
      dy[i+2] = dy[i+2] + da * dx[i+2];
      dy[i+3] = dy[i+3] + da * dx[i+3];
    }

  }

  return;
}